

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_msa(CPUMIPSState_conflict8 *env,DisasContext_conflict6 *ctx)

{
  TCGv_ptr pTVar1;
  target_ulong tVar2;
  uint uVar3;
  uintptr_t o_12;
  TCGTemp *pTVar4;
  TCGv_i32 pTVar5;
  TCGv_i32 pTVar6;
  TCGv_i32 pTVar7;
  ulong uVar8;
  TCGv_i32 pTVar9;
  TCGv_i32 pTVar10;
  uintptr_t o_291;
  TCGv_i64 pTVar11;
  uintptr_t o_294;
  TCGContext_conflict6 *pTVar12;
  uintptr_t o_27;
  int32_t val;
  TCGOpcode opc;
  code *pcVar13;
  uint uVar14;
  int iVar15;
  uintptr_t o_2;
  TCGv_i64 pTVar16;
  uintptr_t o_28;
  uintptr_t o_1;
  uint val_00;
  uint uVar17;
  uintptr_t o;
  uintptr_t o_334;
  TCGTemp *local_68;
  TCGTemp *local_60;
  TCGv_i32 local_58;
  TCGv_i32 local_50;
  TCGv_i32 local_48;
  TCGv_i32 local_38;
  
  pTVar12 = *(TCGContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8);
  tVar2 = (env->active_tc).gpr[7];
  if ((*(byte *)((long)(env->active_tc).gpr + 0x45) & 2) == 0) {
    ctx = (DisasContext_conflict6 *)0x14;
    generate_exception_err((DisasContext_conflict6 *)env,0x14,0);
  }
  uVar14 = (uint)(env->active_tc).gpr[0xc];
  if ((uVar14 & 0x60) == 0x20) {
    ctx = (DisasContext_conflict6 *)0x14;
LAB_009a23a6:
    generate_exception_err((DisasContext_conflict6 *)env,(int)ctx,0);
  }
  else if ((uVar14 >> 0x18 & 1) == 0) {
    ctx = (DisasContext_conflict6 *)0x22;
    if (((env->active_tc).gpr[8] & 0x20000000000) == 0) {
      ctx = (DisasContext_conflict6 *)0x14;
    }
    goto LAB_009a23a6;
  }
  uVar14 = (uint)tVar2 & 0xfc00003f;
  switch(uVar14) {
  case 0x78000000:
  case 0x78000001:
  case 0x78000002:
    pTVar12 = *(TCGContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8);
    uVar14 = (uint)(env->active_tc).gpr[7];
    pTVar5 = tcg_const_i32_mips64el(pTVar12,uVar14 >> 6 & 0x1f);
    pTVar6 = tcg_const_i32_mips64el(pTVar12,uVar14 >> 0xb & 0x1f);
    pTVar9 = tcg_const_i32_mips64el(pTVar12,uVar14 >> 0x10 & 0xff);
    uVar14 = (uint)(env->active_tc).gpr[7];
    uVar3 = uVar14 & 0xff00003f;
    if ((int)uVar3 < 0x79000002) {
      if ((int)uVar3 < 0x78000002) {
        if (uVar3 == 0x78000000) {
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_andi_b_mips64el;
        }
        else {
          if (uVar3 != 0x78000001) goto LAB_009a0296;
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_bmnzi_b_mips64el;
        }
      }
      else {
        if (uVar3 == 0x78000002) goto LAB_009a0287;
        if (uVar3 == 0x79000000) {
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_ori_b_mips64el;
        }
        else {
          if (uVar3 != 0x79000001) goto LAB_009a0296;
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_bmzi_b_mips64el;
        }
      }
LAB_009a06f9:
      local_50 = pTVar9 + (long)&pTVar12->pool_cur;
      local_58 = pTVar6 + (long)&pTVar12->pool_cur;
      local_60 = (TCGTemp *)(pTVar5 + (long)&pTVar12->pool_cur);
      tcg_gen_callN_mips64el(pTVar12,pcVar13,(TCGTemp *)0x0,4,&local_68);
    }
    else {
      if (0x7a000000 < (int)uVar3) {
        if (uVar3 == 0x7a000001) {
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_bseli_b_mips64el;
        }
        else {
          if (uVar3 == 0x7a000002) goto LAB_009a0287;
          if (uVar3 != 0x7b000000) goto LAB_009a0296;
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_xori_b_mips64el;
        }
        goto LAB_009a06f9;
      }
      if (uVar3 != 0x79000002) {
        if (uVar3 != 0x7a000000) goto LAB_009a0296;
        local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
        pcVar13 = helper_msa_nori_b_mips64el;
        goto LAB_009a06f9;
      }
LAB_009a0287:
      uVar14 = uVar14 >> 0x18 & 3;
      if (uVar14 == 3) {
LAB_009a0296:
        generate_exception_err((DisasContext_conflict6 *)env,0x14,0);
      }
      else {
        pTVar7 = tcg_const_i32_mips64el(pTVar12,uVar14);
        local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
        local_58 = pTVar5 + (long)&pTVar12->pool_cur;
        local_50 = pTVar6 + (long)&pTVar12->pool_cur;
        local_48 = pTVar9 + (long)&pTVar12->pool_cur;
        local_60 = (TCGTemp *)(pTVar7 + (long)pTVar12);
        tcg_gen_callN_mips64el(pTVar12,helper_msa_shf_df_mips64el,(TCGTemp *)0x0,5,&local_68);
        tcg_temp_free_internal_mips64el(pTVar12,(TCGTemp *)(pTVar7 + (long)pTVar12));
      }
    }
    tcg_temp_free_internal_mips64el(pTVar12,(TCGTemp *)(pTVar5 + (long)pTVar12));
    pTVar4 = (TCGTemp *)(pTVar6 + (long)pTVar12);
    break;
  default:
    goto switchD_0099f9e7_caseD_78000003;
  case 0x78000006:
  case 0x78000007:
    pTVar12 = *(TCGContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8);
    uVar14 = (uint)(env->active_tc).gpr[7];
    iVar15 = (int)(uVar14 << 0xb) >> 0x1b;
    local_38 = tcg_const_i32_mips64el(pTVar12,uVar14 >> 0x15 & 3);
    pTVar5 = tcg_const_i32_mips64el(pTVar12,uVar14 >> 6 & 0x1f);
    pTVar6 = tcg_const_i32_mips64el(pTVar12,uVar14 >> 0xb & 0x1f);
    pTVar4 = tcg_temp_new_internal_mips64el(pTVar12,TCG_TYPE_I32,false);
    pTVar7 = (TCGv_i32)((long)pTVar4 - (long)pTVar12);
    tcg_gen_op2_mips64el(pTVar12,INDEX_op_movi_i32,(TCGArg)pTVar4,(ulong)(uVar14 >> 0x10 & 0x1f));
    uVar14 = (uint)(env->active_tc).gpr[7];
    uVar3 = uVar14 & 0xff80003f;
    if ((int)uVar3 < 0x79800007) {
      if ((int)uVar3 < 0x79000006) {
        if (uVar3 == 0x78000006) {
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          local_60 = (TCGTemp *)(local_38 + (long)&pTVar12->pool_cur);
          pcVar13 = helper_msa_addvi_df_mips64el;
        }
        else if (uVar3 == 0x78000007) {
          tcg_gen_op2_mips64el(pTVar12,INDEX_op_movi_i32,(TCGArg)pTVar4,(long)iVar15);
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          local_60 = (TCGTemp *)(local_38 + (long)&pTVar12->pool_cur);
          pcVar13 = helper_msa_ceqi_df_mips64el;
        }
        else {
          if (uVar3 != 0x78800006) {
LAB_009a0e67:
            generate_exception_err((DisasContext_conflict6 *)env,0x14,0);
            pTVar9 = local_38;
            goto LAB_009a0e54;
          }
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          local_60 = (TCGTemp *)(local_38 + (long)&pTVar12->pool_cur);
          pcVar13 = helper_msa_subvi_df_mips64el;
        }
      }
      else if (uVar3 == 0x79000006) {
        tcg_gen_op2_mips64el(pTVar12,INDEX_op_movi_i32,(TCGArg)pTVar4,(long)iVar15);
        local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
        local_60 = (TCGTemp *)(local_38 + (long)&pTVar12->pool_cur);
        pcVar13 = helper_msa_maxi_s_df_mips64el;
      }
      else if (uVar3 == 0x79000007) {
        tcg_gen_op2_mips64el(pTVar12,INDEX_op_movi_i32,(TCGArg)pTVar4,(long)iVar15);
        local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
        local_60 = (TCGTemp *)(local_38 + (long)&pTVar12->pool_cur);
        pcVar13 = helper_msa_clti_s_df_mips64el;
      }
      else {
        if (uVar3 != 0x79800006) goto LAB_009a0e67;
        local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
        local_60 = (TCGTemp *)(local_38 + (long)&pTVar12->pool_cur);
        pcVar13 = helper_msa_maxi_u_df_mips64el;
      }
LAB_009a0e45:
      pTVar9 = local_38;
      local_48 = (TCGv_i32)((long)pTVar12 + (long)pTVar7);
      local_50 = pTVar6 + (long)&pTVar12->pool_cur;
      local_58 = pTVar5 + (long)&pTVar12->pool_cur;
      tcg_gen_callN_mips64el(pTVar12,pcVar13,(TCGTemp *)0x0,5,&local_68);
    }
    else {
      if ((int)uVar3 < 0x7a800006) {
        if (uVar3 == 0x79800007) {
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          local_60 = (TCGTemp *)(local_38 + (long)&pTVar12->pool_cur);
          pcVar13 = helper_msa_clti_u_df_mips64el;
        }
        else if (uVar3 == 0x7a000006) {
          tcg_gen_op2_mips64el(pTVar12,INDEX_op_movi_i32,(TCGArg)pTVar4,(long)iVar15);
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          local_60 = (TCGTemp *)(local_38 + (long)&pTVar12->pool_cur);
          pcVar13 = helper_msa_mini_s_df_mips64el;
        }
        else {
          if (uVar3 != 0x7a000007) goto LAB_009a0e67;
          tcg_gen_op2_mips64el(pTVar12,INDEX_op_movi_i32,(TCGArg)pTVar4,(long)iVar15);
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          local_60 = (TCGTemp *)(local_38 + (long)&pTVar12->pool_cur);
          pcVar13 = helper_msa_clei_s_df_mips64el;
        }
        goto LAB_009a0e45;
      }
      if (uVar3 == 0x7a800006) {
        local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
        local_60 = (TCGTemp *)(local_38 + (long)&pTVar12->pool_cur);
        pcVar13 = helper_msa_mini_u_df_mips64el;
        goto LAB_009a0e45;
      }
      if (uVar3 == 0x7a800007) {
        local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
        local_60 = (TCGTemp *)(local_38 + (long)&pTVar12->pool_cur);
        pcVar13 = helper_msa_clei_u_df_mips64el;
        goto LAB_009a0e45;
      }
      if (uVar3 != 0x7b000007) goto LAB_009a0e67;
      tcg_gen_op2_mips64el
                (pTVar12,INDEX_op_movi_i32,(TCGArg)pTVar4,(long)((int)(uVar14 << 0xb) >> 0x16));
      pTVar9 = local_38;
      local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
      local_60 = (TCGTemp *)(local_38 + (long)&pTVar12->pool_cur);
      local_58 = pTVar5 + (long)&pTVar12->pool_cur;
      local_50 = (TCGv_i32)((long)pTVar12 + (long)pTVar7);
      tcg_gen_callN_mips64el(pTVar12,helper_msa_ldi_df_mips64el,(TCGTemp *)0x0,4,&local_68);
    }
LAB_009a0e54:
    tcg_temp_free_internal_mips64el(pTVar12,(TCGTemp *)(pTVar9 + (long)pTVar12));
LAB_009a17cc:
    pTVar4 = (TCGTemp *)(pTVar5 + (long)pTVar12);
    goto LAB_009a17d5;
  case 0x78000009:
  case 0x7800000a:
    pTVar12 = *(TCGContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8);
    uVar14 = (uint)(env->active_tc).gpr[7];
    if ((uVar14 >> 0x16 & 1) == 0) {
      val = 3;
      uVar3 = 0x3f;
    }
    else if ((uVar14 & 0x600000) == 0x400000) {
      val = 2;
      uVar3 = 0x1f;
    }
    else if ((uVar14 & 0x700000) == 0x600000) {
      val = 1;
      uVar3 = 0xf;
    }
    else {
      if ((uVar14 & 0x780000) != 0x700000) goto switchD_0099f9e7_caseD_78000003;
      val = 0;
      uVar3 = 7;
    }
    pTVar5 = tcg_const_i32_mips64el(pTVar12,val);
    pTVar9 = tcg_const_i32_mips64el(pTVar12,uVar14 >> 0x10 & uVar3);
    pTVar6 = tcg_const_i32_mips64el(pTVar12,uVar14 >> 6 & 0x1f);
    pTVar7 = tcg_const_i32_mips64el(pTVar12,uVar14 >> 0xb & 0x1f);
    uVar14 = (uint)(env->active_tc).gpr[7] & 0xff80003f;
    if ((int)uVar14 < 0x79800009) {
      if (0x78800009 < (int)uVar14) {
        if (uVar14 == 0x7880000a) {
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_sat_u_df_mips64el;
        }
        else if (uVar14 == 0x79000009) {
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_srli_df_mips64el;
        }
        else {
          if (uVar14 != 0x7900000a) goto LAB_009a1349;
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_srari_df_mips64el;
        }
        goto LAB_009a131e;
      }
      if (uVar14 == 0x78000009) {
        local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
        pcVar13 = helper_msa_slli_df_mips64el;
        goto LAB_009a131e;
      }
      if (uVar14 == 0x7800000a) {
        local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
        pcVar13 = helper_msa_sat_s_df_mips64el;
        goto LAB_009a131e;
      }
      if (uVar14 == 0x78800009) {
        local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
        pcVar13 = helper_msa_srai_df_mips64el;
        goto LAB_009a131e;
      }
LAB_009a1349:
      generate_exception_err((DisasContext_conflict6 *)env,0x14,0);
    }
    else {
      if ((int)uVar14 < 0x7a800009) {
        if (uVar14 == 0x79800009) {
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_bclri_df_mips64el;
        }
        else if (uVar14 == 0x7980000a) {
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_srlri_df_mips64el;
        }
        else {
          if (uVar14 != 0x7a000009) goto LAB_009a1349;
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_bseti_df_mips64el;
        }
      }
      else if (uVar14 == 0x7a800009) {
        local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
        pcVar13 = helper_msa_bnegi_df_mips64el;
      }
      else if (uVar14 == 0x7b000009) {
        local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
        pcVar13 = helper_msa_binsli_df_mips64el;
      }
      else {
        if (uVar14 != 0x7b800009) goto LAB_009a1349;
        local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
        pcVar13 = helper_msa_binsri_df_mips64el;
      }
LAB_009a131e:
      local_48 = pTVar9 + (long)&pTVar12->pool_cur;
      local_50 = pTVar7 + (long)&pTVar12->pool_cur;
      local_58 = pTVar6 + (long)&pTVar12->pool_cur;
      local_60 = (TCGTemp *)(pTVar5 + (long)&pTVar12->pool_cur);
      tcg_gen_callN_mips64el(pTVar12,pcVar13,(TCGTemp *)0x0,5,&local_68);
    }
    tcg_temp_free_internal_mips64el(pTVar12,(TCGTemp *)(pTVar5 + (long)pTVar12));
    pTVar4 = (TCGTemp *)(pTVar9 + (long)pTVar12);
LAB_009a17d5:
    tcg_temp_free_internal_mips64el(pTVar12,pTVar4);
    tcg_temp_free_internal_mips64el(pTVar12,(TCGTemp *)(pTVar6 + (long)pTVar12));
    pTVar4 = (TCGTemp *)(pTVar7 + (long)pTVar12);
    goto LAB_009a2064;
  case 0x7800000d:
  case 0x7800000e:
  case 0x7800000f:
  case 0x78000010:
  case 0x78000011:
  case 0x78000012:
  case 0x78000013:
  case 0x78000014:
  case 0x78000015:
    gen_msa_3r(env,ctx);
    return;
  case 0x78000019:
    uVar14 = (uint)(env->active_tc).gpr[7];
    if ((uVar14 & 0x300000) != 0) {
      if ((uVar14 & 0x380000) == 0x200000) {
        uVar17 = 1;
        uVar3 = 7;
        goto LAB_009a0a9b;
      }
      if ((uVar14 & 0x3c0000) == 0x300000) {
        uVar17 = 2;
        uVar3 = 3;
        goto LAB_009a0a9b;
      }
      if ((uVar14 & 0x3e0000) == 0x380000) {
        uVar17 = 3;
        uVar3 = 1;
        goto LAB_009a0a9b;
      }
      if ((uVar14 & 0x3f0000) != 0x3e0000) goto switchD_0099f9e7_caseD_78000003;
      pTVar12 = *(TCGContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8);
      uVar3 = uVar14 >> 0xb & 0x1f;
      uVar17 = uVar14 >> 6 & 0x1f;
      pTVar4 = tcg_temp_new_internal_mips64el(pTVar12,TCG_TYPE_I64,false);
      pTVar16 = (TCGv_i64)((long)pTVar4 - (long)pTVar12);
      pTVar9 = tcg_const_i32_mips64el(pTVar12,uVar3);
      pTVar5 = tcg_const_i32_mips64el(pTVar12,uVar17);
      uVar14 = (uint)(env->active_tc).gpr[7] & 0xffff003f;
      if (uVar14 == 0x78be0019) {
        pTVar1 = pTVar12->cpu_env;
        pcVar13 = helper_msa_move_v_mips64el;
        pTVar11 = (TCGv_i64)pTVar5;
        local_58 = pTVar9;
LAB_009a29a1:
        local_58 = local_58 + (long)&pTVar12->pool_cur;
        local_60 = (TCGTemp *)(pTVar11 + (long)&pTVar12->pool_cur);
        local_68 = (TCGTemp *)(pTVar1 + (long)pTVar12);
        tcg_gen_callN_mips64el(pTVar12,pcVar13,(TCGTemp *)0x0,3,&local_68);
      }
      else if (uVar14 == 0x787e0019) {
        local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
        local_60 = (TCGTemp *)(pTVar9 + (long)&pTVar12->pool_cur);
        tcg_gen_callN_mips64el
                  (pTVar12,helper_msa_cfcmsa_mips64el,(TCGTemp *)((long)pTVar12 + (long)pTVar16),2,
                   &local_68);
        if ((uVar17 != 0) && (pTVar12->cpu_gpr[uVar17] != pTVar16)) {
          tcg_gen_op2_mips64el
                    (pTVar12,INDEX_op_mov_i64,(TCGArg)(pTVar12->cpu_gpr[uVar17] + (long)pTVar12),
                     (TCGArg)pTVar4);
        }
      }
      else {
        if (uVar14 == 0x783e0019) {
          if (uVar3 == 0) {
            opc = INDEX_op_movi_i64;
            pTVar11 = (TCGv_i64)0x0;
LAB_009a2973:
            tcg_gen_op2_mips64el(pTVar12,opc,(TCGArg)pTVar4,(TCGArg)pTVar11);
          }
          else if (pTVar12->cpu_gpr[uVar3] != pTVar16) {
            pTVar11 = pTVar12->cpu_gpr[uVar3] + (long)pTVar12;
            opc = INDEX_op_mov_i64;
            goto LAB_009a2973;
          }
          pTVar1 = pTVar12->cpu_env;
          pcVar13 = helper_msa_ctcmsa_mips64el;
          pTVar11 = pTVar16;
          local_58 = pTVar5;
          goto LAB_009a29a1;
        }
        generate_exception_err((DisasContext_conflict6 *)env,0x14,0);
      }
      tcg_temp_free_internal_mips64el(pTVar12,(TCGTemp *)(pTVar16 + (long)pTVar12));
      pTVar4 = (TCGTemp *)(pTVar5 + (long)pTVar12);
      goto LAB_009a2056;
    }
    uVar17 = 0;
    uVar3 = 0xf;
LAB_009a0a9b:
    pTVar12 = *(TCGContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8);
    val_00 = uVar14 >> 6 & 0x1f;
    pTVar5 = tcg_const_i32_mips64el(pTVar12,uVar14 >> 0xb & 0x1f);
    pTVar6 = tcg_const_i32_mips64el(pTVar12,val_00);
    pTVar7 = tcg_const_i32_mips64el(pTVar12,uVar14 >> 0x10 & uVar3);
    pTVar9 = tcg_const_i32_mips64el(pTVar12,uVar17);
    uVar14 = (uint)(env->active_tc).gpr[7] & 0xffc0003f;
    switch((ulong)uVar14 - 0x78000019 << 0x2a | (ulong)uVar14 - 0x78000019 >> 0x16) {
    case 0:
      local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
      pcVar13 = helper_msa_sldi_df_mips64el;
      break;
    case 1:
      local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
      pcVar13 = helper_msa_splati_df_mips64el;
      break;
    case 2:
    case 3:
    case 4:
      if (uVar14 == 0x79000019) {
        (*(code *)(&DAT_00d9fe28 + *(int *)(&DAT_00d9fe28 + (ulong)uVar17 * 4)))();
        return;
      }
      if (uVar14 == 0x78c00019) {
        if (val_00 != 0) {
          (*(code *)(&DAT_00d9fe38 + *(int *)(&DAT_00d9fe38 + (ulong)uVar17 * 4)))();
          return;
        }
      }
      else if ((uVar14 == 0x78800019) && (val_00 != 0)) {
        (*(code *)(&DAT_00d9fe48 + *(int *)(&DAT_00d9fe48 + (ulong)uVar17 * 4)))();
        return;
      }
      goto LAB_009a225e;
    case 5:
      local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
      pcVar13 = helper_msa_insve_df_mips64el;
      break;
    default:
      generate_exception_err((DisasContext_conflict6 *)env,0x14,0);
      goto LAB_009a225e;
    }
    local_48 = pTVar7 + (long)&pTVar12->pool_cur;
    local_50 = pTVar5 + (long)&pTVar12->pool_cur;
    local_58 = pTVar6 + (long)pTVar12;
    local_60 = (TCGTemp *)(pTVar9 + (long)pTVar12);
    tcg_gen_callN_mips64el(pTVar12,pcVar13,(TCGTemp *)0x0,5,&local_68);
LAB_009a225e:
    tcg_temp_free_internal_mips64el(pTVar12,(TCGTemp *)(pTVar6 + (long)pTVar12));
    tcg_temp_free_internal_mips64el(pTVar12,(TCGTemp *)(pTVar5 + (long)pTVar12));
    tcg_temp_free_internal_mips64el(pTVar12,(TCGTemp *)(pTVar7 + (long)pTVar12));
    pTVar4 = (TCGTemp *)(pTVar9 + (long)pTVar12);
    goto LAB_009a2064;
  case 0x7800001a:
  case 0x7800001b:
  case 0x7800001c:
    pTVar12 = *(TCGContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8);
    uVar14 = (uint)(env->active_tc).gpr[7];
    uVar3 = uVar14 >> 0x15 & 1;
    pTVar5 = tcg_const_i32_mips64el(pTVar12,uVar14 >> 6 & 0x1f);
    pTVar6 = tcg_const_i32_mips64el(pTVar12,uVar14 >> 0xb & 0x1f);
    pTVar7 = tcg_const_i32_mips64el(pTVar12,uVar14 >> 0x10 & 0x1f);
    pTVar4 = tcg_temp_new_internal_mips64el(pTVar12,TCG_TYPE_I32,false);
    pTVar9 = (TCGv_i32)((long)pTVar4 - (long)pTVar12);
    tcg_gen_op2_mips64el(pTVar12,INDEX_op_movi_i32,(TCGArg)pTVar4,(ulong)uVar3 + 2);
    uVar14 = (uint)(env->active_tc).gpr[7] & 0xffc0003f;
    if ((int)uVar14 < 0x79c0001b) {
      if ((int)uVar14 < 0x78c0001c) {
        if ((int)uVar14 < 0x7880001a) {
          if ((int)uVar14 < 0x7840001a) {
            if (uVar14 == 0x7800001a) {
              local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
              pcVar13 = helper_msa_fcaf_df_mips64el;
            }
            else {
              if (uVar14 != 0x7800001b) goto LAB_009a2078;
              local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
              pcVar13 = helper_msa_fadd_df_mips64el;
            }
          }
          else if (uVar14 == 0x7840001a) {
            local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
            pcVar13 = helper_msa_fcun_df_mips64el;
          }
          else if (uVar14 == 0x7840001b) {
            local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
            pcVar13 = helper_msa_fsub_df_mips64el;
          }
          else {
            if (uVar14 != 0x7840001c) goto LAB_009a2078;
            local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
            pcVar13 = helper_msa_fcor_df_mips64el;
          }
        }
        else if ((int)uVar14 < 0x7880001c) {
          if (uVar14 == 0x7880001a) {
            local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
            pcVar13 = helper_msa_fceq_df_mips64el;
          }
          else {
            if (uVar14 != 0x7880001b) goto LAB_009a2078;
            local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
            pcVar13 = helper_msa_fmul_df_mips64el;
          }
        }
        else if (uVar14 == 0x7880001c) {
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_fcune_df_mips64el;
        }
        else if (uVar14 == 0x78c0001a) {
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_fcueq_df_mips64el;
        }
        else {
          if (uVar14 != 0x78c0001b) goto LAB_009a2078;
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_fdiv_df_mips64el;
        }
      }
      else if ((int)uVar14 < 0x7940001b) {
        if ((int)uVar14 < 0x7900001b) {
          if (uVar14 == 0x78c0001c) {
            local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
            pcVar13 = helper_msa_fcne_df_mips64el;
          }
          else {
            if (uVar14 != 0x7900001a) goto LAB_009a2078;
            local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
            pcVar13 = helper_msa_fclt_df_mips64el;
          }
        }
        else if (uVar14 == 0x7900001b) {
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_fmadd_df_mips64el;
        }
        else if (uVar14 == 0x7900001c) {
          tcg_gen_op2_mips64el(pTVar12,INDEX_op_movi_i32,(TCGArg)pTVar4,(ulong)(uVar3 + 1));
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_mul_q_df_mips64el;
        }
        else {
          if (uVar14 != 0x7940001a) goto LAB_009a2078;
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_fcult_df_mips64el;
        }
      }
      else if ((int)uVar14 < 0x7980001a) {
        if (uVar14 == 0x7940001b) {
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_fmsub_df_mips64el;
        }
        else {
          if (uVar14 != 0x7940001c) goto LAB_009a2078;
          tcg_gen_op2_mips64el(pTVar12,INDEX_op_movi_i32,(TCGArg)pTVar4,(ulong)(uVar3 + 1));
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_madd_q_df_mips64el;
        }
      }
      else if (uVar14 == 0x7980001a) {
        local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
        pcVar13 = helper_msa_fcle_df_mips64el;
      }
      else if (uVar14 == 0x7980001c) {
        tcg_gen_op2_mips64el(pTVar12,INDEX_op_movi_i32,(TCGArg)pTVar4,(ulong)(uVar3 + 1));
        local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
        pcVar13 = helper_msa_msub_q_df_mips64el;
      }
      else {
        if (uVar14 != 0x79c0001a) goto LAB_009a2078;
        local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
        pcVar13 = helper_msa_fcule_df_mips64el;
      }
LAB_009a2022:
      local_48 = pTVar7 + (long)&pTVar12->pool_cur;
      local_50 = pTVar6 + (long)&pTVar12->pool_cur;
      local_58 = pTVar5 + (long)&pTVar12->pool_cur;
      local_60 = (TCGTemp *)((long)pTVar12 + (long)pTVar9);
      tcg_gen_callN_mips64el(pTVar12,pcVar13,(TCGTemp *)0x0,5,&local_68);
    }
    else {
      if ((int)uVar14 < 0x7b00001a) {
        if ((int)uVar14 < 0x7a80001a) {
          if ((int)uVar14 < 0x7a00001b) {
            if (uVar14 == 0x79c0001b) {
              local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
              pcVar13 = helper_msa_fexp2_df_mips64el;
            }
            else {
              if (uVar14 != 0x7a00001a) goto LAB_009a2078;
              local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
              pcVar13 = helper_msa_fsaf_df_mips64el;
            }
          }
          else if (uVar14 == 0x7a00001b) {
            local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
            pcVar13 = helper_msa_fexdo_df_mips64el;
          }
          else if (uVar14 == 0x7a40001a) {
            local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
            pcVar13 = helper_msa_fsun_df_mips64el;
          }
          else {
            if (uVar14 != 0x7a40001c) goto LAB_009a2078;
            local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
            pcVar13 = helper_msa_fsor_df_mips64el;
          }
        }
        else if ((int)uVar14 < 0x7a80001c) {
          if (uVar14 == 0x7a80001a) {
            local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
            pcVar13 = helper_msa_fseq_df_mips64el;
          }
          else {
            if (uVar14 != 0x7a80001b) goto LAB_009a2078;
            local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
            pcVar13 = helper_msa_ftq_df_mips64el;
          }
        }
        else if (uVar14 == 0x7a80001c) {
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_fsune_df_mips64el;
        }
        else if (uVar14 == 0x7ac0001a) {
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_fsueq_df_mips64el;
        }
        else {
          if (uVar14 != 0x7ac0001c) goto LAB_009a2078;
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_fsne_df_mips64el;
        }
        goto LAB_009a2022;
      }
      if (0x7b40001b < (int)uVar14) {
        if ((int)uVar14 < 0x7b80001c) {
          if (uVar14 == 0x7b40001c) {
            tcg_gen_op2_mips64el(pTVar12,INDEX_op_movi_i32,(TCGArg)pTVar4,(ulong)(uVar3 + 1));
            local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
            pcVar13 = helper_msa_maddr_q_df_mips64el;
          }
          else if (uVar14 == 0x7b80001a) {
            local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
            pcVar13 = helper_msa_fsle_df_mips64el;
          }
          else {
            if (uVar14 != 0x7b80001b) goto LAB_009a2078;
            local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
            pcVar13 = helper_msa_fmax_df_mips64el;
          }
        }
        else if (uVar14 == 0x7b80001c) {
          tcg_gen_op2_mips64el(pTVar12,INDEX_op_movi_i32,(TCGArg)pTVar4,(ulong)(uVar3 + 1));
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_msubr_q_df_mips64el;
        }
        else if (uVar14 == 0x7bc0001a) {
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_fsule_df_mips64el;
        }
        else {
          if (uVar14 != 0x7bc0001b) goto LAB_009a2078;
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_fmax_a_df_mips64el;
        }
        goto LAB_009a2022;
      }
      if (0x7b00001b < (int)uVar14) {
        if (uVar14 == 0x7b00001c) {
          tcg_gen_op2_mips64el(pTVar12,INDEX_op_movi_i32,(TCGArg)pTVar4,(ulong)(uVar3 + 1));
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_mulr_q_df_mips64el;
        }
        else if (uVar14 == 0x7b40001a) {
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_fsult_df_mips64el;
        }
        else {
          if (uVar14 != 0x7b40001b) goto LAB_009a2078;
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_fmin_a_df_mips64el;
        }
        goto LAB_009a2022;
      }
      if (uVar14 == 0x7b00001a) {
        local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
        pcVar13 = helper_msa_fslt_df_mips64el;
        goto LAB_009a2022;
      }
      if (uVar14 == 0x7b00001b) {
        local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
        pcVar13 = helper_msa_fmin_df_mips64el;
        goto LAB_009a2022;
      }
LAB_009a2078:
      generate_exception_err((DisasContext_conflict6 *)env,0x14,0);
    }
    pTVar4 = (TCGTemp *)(pTVar5 + (long)pTVar12);
LAB_009a203a:
    tcg_temp_free_internal_mips64el(pTVar12,pTVar4);
    tcg_temp_free_internal_mips64el(pTVar12,(TCGTemp *)(pTVar6 + (long)pTVar12));
    pTVar4 = (TCGTemp *)(pTVar7 + (long)pTVar12);
LAB_009a2056:
    tcg_temp_free_internal_mips64el(pTVar12,pTVar4);
    pTVar4 = (TCGTemp *)(pTVar9 + (long)pTVar12);
    goto LAB_009a2064;
  case 0x7800001e:
    uVar14 = (uint)(env->active_tc).gpr[7];
    uVar3 = uVar14 & 0xffe0003f;
    if ((int)uVar3 < 0x7880001e) {
      if ((int)uVar3 < 0x7840001e) {
        if ((uVar3 != 0x7800001e) && (uVar3 != 0x7820001e)) {
switchD_0099f9e7_caseD_78000003:
          generate_exception_err((DisasContext_conflict6 *)env,0x14,0);
          return;
        }
      }
      else if ((uVar3 != 0x7840001e) && (uVar3 != 0x7860001e)) goto switchD_0099f9e7_caseD_78000003;
LAB_009a0962:
      pTVar12 = *(TCGContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8);
      pTVar5 = tcg_const_i32_mips64el(pTVar12,uVar14 >> 6 & 0x1f);
      pTVar6 = tcg_const_i32_mips64el(pTVar12,uVar14 >> 0xb & 0x1f);
      pTVar7 = tcg_const_i32_mips64el(pTVar12,uVar14 >> 0x10 & 0x1f);
      uVar8 = (ulong)((uint)(env->active_tc).gpr[7] & 0xffe0003f) - 0x7800001e;
      switch(uVar8 << 0x2b | uVar8 >> 0x15) {
      case 0:
        local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
        pcVar13 = helper_msa_and_v_mips64el;
        break;
      case 1:
        local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
        pcVar13 = helper_msa_or_v_mips64el;
        break;
      case 2:
        local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
        pcVar13 = helper_msa_nor_v_mips64el;
        break;
      case 3:
        local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
        pcVar13 = helper_msa_xor_v_mips64el;
        break;
      case 4:
        local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
        pcVar13 = helper_msa_bmnz_v_mips64el;
        break;
      case 5:
        local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
        pcVar13 = helper_msa_bmz_v_mips64el;
        break;
      case 6:
        local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
        pcVar13 = helper_msa_bsel_v_mips64el;
        break;
      default:
        generate_exception_err((DisasContext_conflict6 *)env,0x14,0);
        goto LAB_009a17cc;
      }
      local_50 = pTVar7 + (long)&pTVar12->pool_cur;
      local_58 = pTVar6 + (long)&pTVar12->pool_cur;
      local_60 = (TCGTemp *)(pTVar5 + (long)&pTVar12->pool_cur);
      tcg_gen_callN_mips64el(pTVar12,pcVar13,(TCGTemp *)0x0,4,&local_68);
      goto LAB_009a17cc;
    }
    if ((int)uVar3 < 0x78c0001e) {
      if ((uVar3 != 0x7880001e) && (uVar3 != 0x78a0001e)) goto switchD_0099f9e7_caseD_78000003;
      goto LAB_009a0962;
    }
    if (uVar3 != 0x7b20001e) {
      if (uVar3 != 0x7b00001e) {
        if (uVar3 != 0x78c0001e) goto switchD_0099f9e7_caseD_78000003;
        goto LAB_009a0962;
      }
      pTVar12 = *(TCGContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8);
      uVar3 = uVar14 >> 0x10 & 3;
      pTVar5 = tcg_const_i32_mips64el(pTVar12,uVar14 >> 6 & 0x1f);
      pTVar6 = tcg_const_i32_mips64el(pTVar12,uVar14 >> 0xb & 0x1f);
      pTVar7 = tcg_const_i32_mips64el(pTVar12,uVar14 >> 0x10 & 0x1f);
      pTVar9 = tcg_const_i32_mips64el(pTVar12,uVar3);
      uVar8 = (ulong)((uint)(env->active_tc).gpr[7] & 0xfffc003f) - 0x7b00001e;
      switch(uVar8 << 0x2e | uVar8 >> 0x12) {
      case 0:
        local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
        local_50 = pTVar6 + (long)&pTVar12->pool_cur;
        pcVar13 = helper_msa_fill_df_mips64el;
        iVar15 = 4;
        pTVar10 = pTVar9;
        local_58 = pTVar5;
        goto LAB_009a294e;
      case 1:
        switch(uVar3) {
        case 0:
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_pcnt_b_mips64el;
          break;
        case 1:
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_pcnt_h_mips64el;
          break;
        case 2:
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_pcnt_w_mips64el;
          break;
        case 3:
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_pcnt_d_mips64el;
        }
        break;
      case 2:
        switch(uVar3) {
        case 0:
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_nloc_b_mips64el;
          break;
        case 1:
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_nloc_h_mips64el;
          break;
        case 2:
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_nloc_w_mips64el;
          break;
        case 3:
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_nloc_d_mips64el;
        }
        break;
      case 3:
        switch(uVar3) {
        case 0:
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_nlzc_b_mips64el;
          break;
        case 1:
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_nlzc_h_mips64el;
          break;
        case 2:
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_nlzc_w_mips64el;
          break;
        case 3:
          local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
          pcVar13 = helper_msa_nlzc_d_mips64el;
        }
        break;
      default:
        generate_exception_err((DisasContext_conflict6 *)env,0x14,0);
        goto LAB_009a2953;
      }
      iVar15 = 3;
      pTVar10 = pTVar5;
      local_58 = pTVar6;
LAB_009a294e:
      local_58 = local_58 + (long)&pTVar12->pool_cur;
      local_60 = (TCGTemp *)(pTVar10 + (long)&pTVar12->pool_cur);
      tcg_gen_callN_mips64el(pTVar12,pcVar13,(TCGTemp *)0x0,iVar15,&local_68);
LAB_009a2953:
      pTVar4 = (TCGTemp *)(pTVar5 + (long)pTVar12);
      goto LAB_009a203a;
    }
    pTVar12 = *(TCGContext_conflict6 **)((env->active_tc).gpr[0x15] + 0x2e8);
    pTVar5 = tcg_const_i32_mips64el(pTVar12,uVar14 >> 6 & 0x1f);
    pTVar6 = tcg_const_i32_mips64el(pTVar12,uVar14 >> 0xb & 0x1f);
    pTVar7 = tcg_const_i32_mips64el(pTVar12,uVar14 >> 0x10 & 0x1f);
    pTVar9 = tcg_const_i32_mips64el(pTVar12,uVar14 >> 0x10 & 1 | 2);
    uVar8 = (ulong)((uint)(env->active_tc).gpr[7] & 0xfffe003f) - 0x7b20001e;
    switch(uVar8 << 0x2f | uVar8 >> 0x11) {
    case 0:
      local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
      pcVar13 = helper_msa_fclass_df_mips64el;
      break;
    case 1:
      local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
      pcVar13 = helper_msa_ftrunc_s_df_mips64el;
      break;
    case 2:
      local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
      pcVar13 = helper_msa_ftrunc_u_df_mips64el;
      break;
    case 3:
      local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
      pcVar13 = helper_msa_fsqrt_df_mips64el;
      break;
    case 4:
      local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
      pcVar13 = helper_msa_frsqrt_df_mips64el;
      break;
    case 5:
      local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
      pcVar13 = helper_msa_frcp_df_mips64el;
      break;
    case 6:
      local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
      pcVar13 = helper_msa_frint_df_mips64el;
      break;
    case 7:
      local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
      pcVar13 = helper_msa_flog2_df_mips64el;
      break;
    case 8:
      local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
      pcVar13 = helper_msa_fexupl_df_mips64el;
      break;
    case 9:
      local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
      pcVar13 = helper_msa_fexupr_df_mips64el;
      break;
    case 10:
      local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
      pcVar13 = helper_msa_ffql_df_mips64el;
      break;
    case 0xb:
      local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
      pcVar13 = helper_msa_ffqr_df_mips64el;
      break;
    case 0xc:
      local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
      pcVar13 = helper_msa_ftint_s_df_mips64el;
      break;
    case 0xd:
      local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
      pcVar13 = helper_msa_ftint_u_df_mips64el;
      break;
    case 0xe:
      local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
      pcVar13 = helper_msa_ffint_s_df_mips64el;
      break;
    case 0xf:
      local_68 = (TCGTemp *)(pTVar12->cpu_env + (long)pTVar12);
      pcVar13 = helper_msa_ffint_u_df_mips64el;
      break;
    default:
      goto switchD_009a14c5_default;
    }
    local_50 = pTVar6 + (long)&pTVar12->pool_cur;
    local_58 = pTVar5 + (long)&pTVar12->pool_cur;
    local_60 = (TCGTemp *)(pTVar9 + (long)&pTVar12->pool_cur);
    tcg_gen_callN_mips64el(pTVar12,pcVar13,(TCGTemp *)0x0,4,&local_68);
switchD_009a14c5_default:
    tcg_temp_free_internal_mips64el(pTVar12,(TCGTemp *)(pTVar5 + (long)pTVar12));
    tcg_temp_free_internal_mips64el(pTVar12,(TCGTemp *)(pTVar6 + (long)pTVar12));
    pTVar4 = (TCGTemp *)(pTVar7 + (long)pTVar12);
    break;
  case 0x78000020:
  case 0x78000021:
  case 0x78000022:
  case 0x78000023:
  case 0x78000024:
  case 0x78000025:
  case 0x78000026:
  case 0x78000027:
    uVar3 = (uint)(env->active_tc).gpr[7];
    tcg_const_i32_mips64el(pTVar12,uVar3 >> 6 & 0x1f);
    pTVar4 = tcg_temp_new_internal_mips64el(pTVar12,TCG_TYPE_I64,false);
    gen_base_offset_addr
              ((DisasContext_conflict6 *)env,(TCGv_i64)((long)pTVar4 - (long)pTVar12),
               uVar3 >> 0xb & 0x1f,((int)(uVar3 << 6) >> 0x16) << ((byte)uVar3 & 3));
    (*(code *)(&DAT_00d9fd54 + *(int *)(&DAT_00d9fd54 + (ulong)(uVar14 + 0x87ffffe0) * 4)))();
    return;
  }
  tcg_temp_free_internal_mips64el(pTVar12,pTVar4);
  pTVar4 = (TCGTemp *)(pTVar9 + (long)pTVar12);
LAB_009a2064:
  tcg_temp_free_internal_mips64el(pTVar12,pTVar4);
  return;
}

Assistant:

static void gen_msa(CPUMIPSState *env, DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    uint32_t opcode = ctx->opcode;
    check_insn(ctx, ASE_MSA);
    check_msa_access(ctx);

    switch (MASK_MSA_MINOR(opcode)) {
    case OPC_MSA_I8_00:
    case OPC_MSA_I8_01:
    case OPC_MSA_I8_02:
        gen_msa_i8(env, ctx);
        break;
    case OPC_MSA_I5_06:
    case OPC_MSA_I5_07:
        gen_msa_i5(env, ctx);
        break;
    case OPC_MSA_BIT_09:
    case OPC_MSA_BIT_0A:
        gen_msa_bit(env, ctx);
        break;
    case OPC_MSA_3R_0D:
    case OPC_MSA_3R_0E:
    case OPC_MSA_3R_0F:
    case OPC_MSA_3R_10:
    case OPC_MSA_3R_11:
    case OPC_MSA_3R_12:
    case OPC_MSA_3R_13:
    case OPC_MSA_3R_14:
    case OPC_MSA_3R_15:
        gen_msa_3r(env, ctx);
        break;
    case OPC_MSA_ELM:
        gen_msa_elm(env, ctx);
        break;
    case OPC_MSA_3RF_1A:
    case OPC_MSA_3RF_1B:
    case OPC_MSA_3RF_1C:
        gen_msa_3rf(env, ctx);
        break;
    case OPC_MSA_VEC:
        gen_msa_vec(env, ctx);
        break;
    case OPC_LD_B:
    case OPC_LD_H:
    case OPC_LD_W:
    case OPC_LD_D:
    case OPC_ST_B:
    case OPC_ST_H:
    case OPC_ST_W:
    case OPC_ST_D:
        {
            int32_t s10 = sextract32(ctx->opcode, 16, 10);
            uint8_t rs = (ctx->opcode >> 11) & 0x1f;
            uint8_t wd = (ctx->opcode >> 6) & 0x1f;
            uint8_t df = (ctx->opcode >> 0) & 0x3;

            TCGv_i32 twd = tcg_const_i32(tcg_ctx, wd);
            TCGv taddr = tcg_temp_new(tcg_ctx);
            gen_base_offset_addr(ctx, taddr, rs, s10 << df);

            switch (MASK_MSA_MINOR(opcode)) {
            case OPC_LD_B:
                gen_helper_msa_ld_b(tcg_ctx, tcg_ctx->cpu_env, twd, taddr);
                break;
            case OPC_LD_H:
                gen_helper_msa_ld_h(tcg_ctx, tcg_ctx->cpu_env, twd, taddr);
                break;
            case OPC_LD_W:
                gen_helper_msa_ld_w(tcg_ctx, tcg_ctx->cpu_env, twd, taddr);
                break;
            case OPC_LD_D:
                gen_helper_msa_ld_d(tcg_ctx, tcg_ctx->cpu_env, twd, taddr);
                break;
            case OPC_ST_B:
                gen_helper_msa_st_b(tcg_ctx, tcg_ctx->cpu_env, twd, taddr);
                break;
            case OPC_ST_H:
                gen_helper_msa_st_h(tcg_ctx, tcg_ctx->cpu_env, twd, taddr);
                break;
            case OPC_ST_W:
                gen_helper_msa_st_w(tcg_ctx, tcg_ctx->cpu_env, twd, taddr);
                break;
            case OPC_ST_D:
                gen_helper_msa_st_d(tcg_ctx, tcg_ctx->cpu_env, twd, taddr);
                break;
            }

            tcg_temp_free_i32(tcg_ctx, twd);
            tcg_temp_free(tcg_ctx, taddr);
        }
        break;
    default:
        MIPS_INVAL("MSA instruction");
        generate_exception_end(ctx, EXCP_RI);
        break;
    }

}